

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

MemoryRegionSection *
memory_region_find_mips
          (MemoryRegionSection *__return_storage_ptr__,MemoryRegion *mr,hwaddr addr,uint64_t size)

{
  MemoryRegionSection *ret;
  MemoryRegionSection local_68;
  uint64_t local_20;
  uint64_t size_local;
  hwaddr addr_local;
  MemoryRegion *mr_local;
  
  local_20 = size;
  size_local = addr;
  addr_local = (hwaddr)mr;
  memory_region_find_rcu(&local_68,mr,addr,size);
  memcpy(__return_storage_ptr__,&local_68,0x40);
  return __return_storage_ptr__;
}

Assistant:

MemoryRegionSection memory_region_find(MemoryRegion *mr,
                                       hwaddr addr, uint64_t size)
{
    MemoryRegionSection ret;

    ret = memory_region_find_rcu(mr, addr, size);
    return ret;
}